

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS
ref_node_interpolate_face
          (REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_INT node2,REF_INT new_node)

{
  double dVar1;
  double dVar2;
  int iVar3;
  REF_GLOB *pRVar4;
  REF_DBL *pRVar5;
  REF_DBL *pRVar6;
  double dVar7;
  uint uVar8;
  undefined8 uVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  REF_DBL log_m [6];
  REF_DBL log_m2 [6];
  REF_DBL log_m1 [6];
  REF_DBL log_m0 [6];
  REF_DBL local_f8;
  double adStack_f0 [6];
  REF_DBL local_c0 [5];
  double dStack_98;
  REF_DBL local_90 [5];
  double dStack_68;
  REF_DBL local_60 [6];
  
  if ((((((node0 < 0) || (iVar3 = ref_node->max, iVar3 <= node0)) || (iVar3 <= node1)) ||
       ((node1 < 0 || (pRVar4 = ref_node->global, pRVar4[(uint)node0] < 0)))) ||
      ((iVar3 <= node2 || ((node2 < 0 || (pRVar4[(uint)node1] < 0)))))) || (pRVar4[(uint)node2] < 0)
     ) {
    pcVar11 = "node invalid";
    uVar8 = 3;
    uVar9 = 0xa5c;
    uVar10 = 3;
  }
  else {
    pRVar5 = ref_node->real;
    lVar12 = 0;
    do {
      pRVar5[new_node * 0xf + lVar12] =
           (pRVar5[(ulong)(uint)(node0 * 0xf) + lVar12] +
            pRVar5[(ulong)(uint)(node1 * 0xf) + lVar12] +
           pRVar5[(ulong)(uint)(node2 * 0xf) + lVar12]) * 0.3333333333333333;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    iVar3 = ref_node->naux;
    if (0 < (long)iVar3) {
      pRVar6 = ref_node->aux;
      lVar12 = 0;
      do {
        pRVar6[iVar3 * new_node + lVar12] =
             (pRVar6[(ulong)(uint)(node0 * iVar3) + lVar12] +
              pRVar6[(ulong)(uint)(node1 * iVar3) + lVar12] +
             pRVar6[(ulong)(uint)(node2 * iVar3) + lVar12]) * 0.3333333333333333;
        lVar12 = lVar12 + 1;
      } while (iVar3 != lVar12);
    }
    lVar12 = 0;
    do {
      local_60[lVar12 + -1] = pRVar5[(int)(node0 * 0xf + 9U + (int)lVar12)];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 6);
    lVar12 = 0;
    do {
      local_90[lVar12 + -1] = pRVar5[(int)(node1 * 0xf + 9U + (int)lVar12)];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 6);
    lVar12 = 0;
    do {
      local_c0[lVar12 + -1] = pRVar5[(int)(node2 * 0xf + 9U + (int)lVar12)];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 6);
    lVar12 = 0;
    do {
      dVar7 = local_60[lVar12];
      dVar1 = local_90[lVar12];
      dVar2 = local_c0[lVar12];
      adStack_f0[lVar12 + -1] =
           (local_60[lVar12 + -1] + local_90[lVar12 + -1] + local_c0[lVar12 + -1]) *
           0.3333333333333333;
      adStack_f0[lVar12] = (dVar7 + dVar1 + dVar2) * 0.3333333333333333;
      lVar12 = lVar12 + 2;
    } while (lVar12 != 6);
    uVar8 = ref_node_metric_set_log(ref_node,new_node,&local_f8);
    if (uVar8 == 0) {
      return 0;
    }
    pcVar11 = "log new";
    uVar9 = 0xa71;
    uVar10 = (ulong)uVar8;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar9,
         "ref_node_interpolate_face",uVar10,pcVar11);
  return uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_node_interpolate_face(REF_NODE ref_node, REF_INT node0,
                                             REF_INT node1, REF_INT node2,
                                             REF_INT new_node) {
  REF_DBL log_m0[6], log_m1[6], log_m2[6], log_m[6];
  REF_INT i;

  if (!ref_node_valid(ref_node, node0) || !ref_node_valid(ref_node, node1) ||
      !ref_node_valid(ref_node, node2))
    RSS(REF_INVALID, "node invalid");

  for (i = 0; i < 3; i++)
    ref_node_xyz(ref_node, i, new_node) =
        (1.0 / 3.0) *
        (ref_node_xyz(ref_node, i, node0) + ref_node_xyz(ref_node, i, node1) +
         ref_node_xyz(ref_node, i, node2));

  for (i = 0; i < ref_node_naux(ref_node); i++)
    ref_node_aux(ref_node, i, new_node) =
        (1.0 / 3.0) *
        (ref_node_aux(ref_node, i, node0) + ref_node_aux(ref_node, i, node1) +
         ref_node_aux(ref_node, i, node2));

  RSS(ref_node_metric_get_log(ref_node, node0, log_m0), "log 0");
  RSS(ref_node_metric_get_log(ref_node, node1, log_m1), "log 1");
  RSS(ref_node_metric_get_log(ref_node, node2, log_m2), "log 2");

  for (i = 0; i < 6; i++)
    log_m[i] = (1.0 / 3.0) * (log_m0[i] + log_m1[i] + log_m2[i]);

  RSS(ref_node_metric_set_log(ref_node, new_node, log_m), "log new");

  return REF_SUCCESS;
}